

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_chain_pdf2
          (Impl *this,void *pNext,ScratchAllocator *alloc,void **out_pnext)

{
  int iVar1;
  bool bVar2;
  VkPhysicalDeviceRobustness2FeaturesEXT *new_data;
  int *piVar3;
  Impl *this_00;
  undefined4 *puVar4;
  VkBaseInStructure *pin;
  void **ppvVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  void *local_38;
  
  ppvVar5 = &local_38;
  local_38 = (void *)0x0;
  piVar3 = (int *)__tls_get_addr(&PTR_00176fb0);
  do {
    this_00 = (Impl *)pnext_chain_pdf2_skip_ignored_entries(pNext);
    if (this_00 == (Impl *)0x0) {
      *out_pnext = local_38;
      break;
    }
    iVar1 = *(int *)&(this_00->allocator).impl;
    if (iVar1 < 0x3b9fcb40) {
      if (iVar1 < 0x3b9f2730) {
        if (iVar1 == 0x3b9ddf10) goto LAB_0012e238;
        if (iVar1 != 0x3b9e3cd3) goto LAB_0012e2b3;
LAB_0012e200:
        puVar4 = (undefined4 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
        if (puVar4 != (undefined4 *)0x0) {
          uVar6 = *(undefined4 *)&(this_00->allocator).impl;
          uVar7 = *(undefined4 *)((long)&(this_00->allocator).impl + 4);
          uVar8 = *(undefined4 *)&(this_00->temp_allocator).impl;
          uVar9 = *(undefined4 *)((long)&(this_00->temp_allocator).impl + 4);
          uVar10 = *(undefined4 *)&(this_00->ycbcr_temp_allocator).impl;
          uVar11 = *(undefined4 *)((long)&(this_00->ycbcr_temp_allocator).impl + 4);
          uVar12 = *(undefined4 *)&this_00->database_iface;
          uVar13 = *(undefined4 *)((long)&this_00->database_iface + 4);
LAB_0012e222:
          puVar4[4] = uVar10;
          puVar4[5] = uVar11;
          puVar4[6] = uVar12;
          puVar4[7] = uVar13;
          goto LAB_0012e25d;
        }
        goto LAB_0012e260;
      }
      if (((iVar1 == 0x3b9f2730) || (iVar1 == 0x3b9f9c62)) || (iVar1 == 0x3b9fc371))
      goto LAB_0012e200;
LAB_0012e2b3:
      if ((*piVar3 < 3) &&
         (bVar2 = Internal::log_thread_callback(LOG_ERROR,"Cannot copy unknown pNext sType: %d.\n"),
         !bVar2)) {
        copy_pnext_chain_pdf2(this_00);
      }
      bVar2 = false;
      pNext = this_00;
    }
    else {
      if (iVar1 < 0x3ba09e30) {
        if (iVar1 != 0x3b9fcb40) {
          if (iVar1 == 0x3b9fe698) goto LAB_0012e238;
          goto LAB_0012e2b3;
        }
        puVar4 = (undefined4 *)ScratchAllocator::allocate_raw(alloc,0x28,0x10);
        if (puVar4 != (undefined4 *)0x0) {
          uVar6 = *(undefined4 *)&(this_00->allocator).impl;
          uVar7 = *(undefined4 *)((long)&(this_00->allocator).impl + 4);
          uVar8 = *(undefined4 *)&(this_00->temp_allocator).impl;
          uVar9 = *(undefined4 *)((long)&(this_00->temp_allocator).impl + 4);
          uVar10 = *(undefined4 *)&(this_00->ycbcr_temp_allocator).impl;
          uVar11 = *(undefined4 *)((long)&(this_00->ycbcr_temp_allocator).impl + 4);
          uVar12 = *(undefined4 *)&this_00->database_iface;
          uVar13 = *(undefined4 *)((long)&this_00->database_iface + 4);
          *(DatabaseInterface **)(puVar4 + 8) = this_00->module_identifier_database_iface;
          goto LAB_0012e222;
        }
      }
      else {
        if (iVar1 == 0x3ba09e30) goto LAB_0012e200;
        if ((iVar1 != 0x3ba0c928) && (iVar1 != 0x3ba224d0)) goto LAB_0012e2b3;
LAB_0012e238:
        puVar4 = (undefined4 *)ScratchAllocator::allocate_raw(alloc,0x18,0x10);
        if (puVar4 == (undefined4 *)0x0) goto LAB_0012e260;
        uVar6 = *(undefined4 *)&(this_00->allocator).impl;
        uVar7 = *(undefined4 *)((long)&(this_00->allocator).impl + 4);
        uVar8 = *(undefined4 *)&(this_00->temp_allocator).impl;
        uVar9 = *(undefined4 *)((long)&(this_00->temp_allocator).impl + 4);
        *(Impl **)(puVar4 + 4) = (this_00->ycbcr_temp_allocator).impl;
LAB_0012e25d:
        *puVar4 = uVar6;
        puVar4[1] = uVar7;
        puVar4[2] = uVar8;
        puVar4[3] = uVar9;
      }
LAB_0012e260:
      *ppvVar5 = puVar4;
      pNext = (this_00->temp_allocator).impl;
      *(undefined8 *)(puVar4 + 2) = 0;
      ppvVar5 = (void **)(puVar4 + 2);
      bVar2 = true;
    }
  } while (bVar2);
  return this_00 == (Impl *)0x0;
}

Assistant:

bool StateRecorder::Impl::copy_pnext_chain_pdf2(const void *pNext, ScratchAllocator &alloc, void **out_pnext)
{
	VkBaseInStructure new_pnext = {};
	const VkBaseInStructure **ppNext = &new_pnext.pNext;

	while ((pNext = pnext_chain_pdf2_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);

		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceRobustness2FeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceImageRobustnessFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV:
		{
			auto *ci = static_cast<const VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR:
		{
			auto *ci = static_cast<const VkPhysicalDeviceFragmentShadingRateFeaturesKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV:
		{
			auto *ci = static_cast<const VkPhysicalDeviceMeshShaderFeaturesNV *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceMeshShaderFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceDescriptorBufferFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceShaderObjectFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		default:
			LOGE_LEVEL("Cannot copy unknown pNext sType: %d.\n", int(pin->sType));
			return false;
		}

		pNext = pin->pNext;
		ppNext = const_cast<const VkBaseInStructure **>(&(*ppNext)->pNext);
		*ppNext = nullptr;
	}

	*out_pnext = (void *)new_pnext.pNext;
	return true;
}